

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_packsl_arm(CPUARMState *env,uint64_t a,uint64_t b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t b_local;
  uint64_t a_local;
  CPUARMState *env_local;
  
  uVar1 = a >> 0x20 & 0xffff;
  uVar2 = uVar1 << 0x10;
  uVar3 = (b & 0xffff) << 0x20;
  uVar4 = (b >> 0x20) << 0x30;
  (env->iwmmxt).cregs[3] =
       (uint)((a & 0x8000) != 0) << 7 | (uint)((a & 0xffff) == 0) << 6 |
       (uint)((uVar2 & 0x80000000) != 0) << 0xf | (uint)(uVar1 == 0) << 0xe |
       (uint)((uVar3 & 0x800000000000) != 0) << 0x17 | (uint)((b & 0xffff) == 0) << 0x16 |
       (uint)((uVar4 & 0x8000000000000000) != 0) << 0x1f | (uint)((b >> 0x20 & 0xffff) == 0) << 0x1e
  ;
  return a & 0xffff | uVar2 | uVar3 | uVar4;
}

Assistant:

uint64_t HELPER(iwmmxt_packsl)(CPUARMState *env, uint64_t a, uint64_t b)
{
    a = (((a >> 0) & 0xffff) << 0) | (((a >> 32) & 0xffff) << 16) |
        (((b >> 0) & 0xffff) << 32) | (((b >> 32) & 0xffff) << 48);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(a >> 0, 0) | NZBIT16(a >> 16, 1) |
        NZBIT16(a >> 32, 2) | NZBIT16(a >> 48, 3);
    return a;
}